

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O0

bool __thiscall draco::MeshSequentialEncoder::CompressAndEncodeIndices(MeshSequentialEncoder *this)

{
  bool bVar1;
  uint uVar2;
  undefined4 uVar3;
  const_reference this_00;
  size_type sVar4;
  MeshEncoder *in_RDI;
  uint32_t encoded_val;
  int32_t index_diff;
  int32_t index_value;
  int j;
  Face *face;
  uint32_t *in_stack_00000078;
  FaceIndex i;
  int num_faces;
  int32_t last_index_value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices_buffer;
  Mesh *in_stack_ffffffffffffff48;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_stack_ffffffffffffff50
  ;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  value_type_conflict5 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_50;
  ValueType local_3c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_38 [4];
  ValueType local_28;
  uint local_24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ac639);
  local_24 = 0;
  MeshEncoder::mesh(in_RDI);
  local_28 = Mesh::num_faces((Mesh *)0x1ac65f);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_38,0);
  while( true ) {
    local_3c = local_28;
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_38,&local_3c);
    if (!bVar1) break;
    MeshEncoder::mesh(in_RDI);
    Mesh::face(in_stack_ffffffffffffff48,(FaceIndex)(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20)
              );
    for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
      this_00 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                operator[](in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      uVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      local_24 = uVar2;
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_38);
  }
  this_01 = &local_20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1ac7c9);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
  uVar3 = (undefined4)sVar4;
  PointCloudEncoder::buffer(&in_RDI->super_PointCloudEncoder);
  EncodeSymbols(in_stack_00000078,face._4_4_,(int)face,_j,_index_diff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(uVar3,in_stack_ffffffffffffff60));
  return true;
}

Assistant:

bool MeshSequentialEncoder::CompressAndEncodeIndices() {
  // Collect all indices to a buffer and encode them.
  // Each new index is a difference from the previous value.
  std::vector<uint32_t> indices_buffer;
  int32_t last_index_value = 0;
  const int num_faces = mesh()->num_faces();
  for (FaceIndex i(0); i < num_faces; ++i) {
    const auto &face = mesh()->face(i);
    for (int j = 0; j < 3; ++j) {
      const int32_t index_value = face[j].value();
      const int32_t index_diff = index_value - last_index_value;
      // Encode signed value to an unsigned one (put the sign to lsb pos).
      const uint32_t encoded_val =
          (abs(index_diff) << 1) | (index_diff < 0 ? 1 : 0);
      indices_buffer.push_back(encoded_val);
      last_index_value = index_value;
    }
  }
  EncodeSymbols(indices_buffer.data(), static_cast<int>(indices_buffer.size()),
                1, nullptr, buffer());
  return true;
}